

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
::multiply_source_and_add_to
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
           *this,Field_element *coefficient,Index sourceColumnIndex,Index targetColumnIndex)

{
  anon_class_32_4_b04cce49 local_48;
  Column *local_28;
  Column *col;
  Index targetColumnIndex_local;
  Index sourceColumnIndex_local;
  Field_element *coefficient_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
  *this_local;
  
  col._0_4_ = targetColumnIndex;
  col._4_4_ = sourceColumnIndex;
  _targetColumnIndex_local = coefficient;
  coefficient_local = (Field_element *)this;
  local_48.col = get_column(this,targetColumnIndex);
  local_48.sourceColumnIndex = (Index *)((long)&col + 4);
  local_48.coefficient = _targetColumnIndex_local;
  local_48.this = this;
  local_28 = local_48.col;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>
  ::
  _add_to<Gudhi::persistence_matrix::Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>::multiply_source_and_add_to(bool_const&,unsigned_int,unsigned_int)::_lambda()_1_>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>
              *)this,local_48.col,&local_48);
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::multiply_source_and_add_to(const Field_element& coefficient,
                                                                    Index sourceColumnIndex,
                                                                    Index targetColumnIndex)
{
  auto& col = get_column(targetColumnIndex);
  _add_to(col, [&]() { col.multiply_source_and_add(get_column(sourceColumnIndex), coefficient); });
}